

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Storage * createStorage(void)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  Storage *in_RDI;
  int size;
  string storageName;
  int local_8c;
  string local_88;
  char *local_68;
  long local_60;
  char local_58 [16];
  string local_48;
  
  local_60 = 0;
  local_58[0] = '\0';
  iVar3 = 0x12;
  local_68 = local_58;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"====",4);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Storage Name(\'r\' for random name):",0x22);
  std::operator>>((istream *)&std::cin,(string *)&local_68);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"How many bytes ",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," have?",6);
  std::istream::operator>>((istream *)&std::cin,&local_8c);
  iVar3 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar3 == 0) {
    Storage::Storage(in_RDI,local_8c);
    Storage::print(in_RDI);
    Storage::name_abi_cxx11_(&local_88,in_RDI);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," created successfully.",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    iVar3 = 0x12;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"====",4);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_68 + local_60);
    Storage::Storage(in_RDI,&local_48,local_8c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    Storage::print(in_RDI);
    Storage::name_abi_cxx11_(&local_88,in_RDI);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," created successfully.",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    iVar3 = 0x12;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"====",4);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return in_RDI;
}

Assistant:

Storage createStorage() {
    string storageName;
    int size;

    for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
        cout<<"====";
    }
    cout<<endl;

    cout<<"Storage Name('r' for random name):";
    cin>>storageName;
    cout<<"How many bytes "<<storageName<<" have?";
    cin>>size;

    if (storageName=="r") {
        Storage storage1(size);
        storage1.print();
        cout << storage1.name() << " created successfully." << endl;
        for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
            cout<<"====";
        }
        cout<<endl<<endl;

        return storage1;
    } else {
        Storage storage1(storageName, size);
        storage1.print();
        cout << storage1.name() << " created successfully." << endl;
        for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
            cout << "====";
        }
        cout << endl<<endl;

        return storage1;
    }
}